

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall SolverTest_StrOptions_Test::TestBody(SolverTest_StrOptions_Test *this)

{
  bool bVar1;
  char ***pppcVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestSolverWithOptions s;
  AssertHelper local_3c0;
  Message local_3b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  AssertHelper local_3a8;
  undefined1 local_3a0 [32];
  pointer local_380;
  pointer local_370;
  TestSolverWithOptions local_360;
  
  TestSolverWithOptions::TestSolverWithOptions(&local_360);
  pcVar3 = (char *)0x0;
  Args::Args((Args *)local_3a0,"stropt1=abc","stropt2=def",(char *)0x0,(char *)0x0,(char *)0x0,
             (char *)0x0);
  pppcVar2 = Args::operator_cast_to_char___((Args *)local_3a0);
  local_3b8.ss_.ptr_._0_1_ =
       (internal)
       mp::BasicSolver::ParseOptions
                 ((BasicSolver *)&local_360,*pppcVar2,1,(ASLProblem *)0x0,(char *)0x0);
  local_3b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_380 != (pointer)0x0) {
    operator_delete(local_380,(long)local_370 - (long)local_380);
  }
  if ((pointer)local_3a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3a0._8_8_,local_3a0._24_8_ - local_3a0._8_8_);
  }
  if (local_3b8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3a0,(internal *)&local_3b8,
               (AssertionResult *)"s.ParseOptions(Args(\"stropt1=abc\", \"stropt2=def\"))","false",
               "true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x3c6,(char *)CONCAT71(local_3a0._1_7_,local_3a0[0]));
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]) != local_3a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]),
                      (ulong)(local_3a0._16_8_ + 1));
    }
    if (local_3c0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_3c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_3a0,"\"abc\"","s.stropt1",(char (*) [4])0x216289,&local_360.stropt1);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message(&local_3b8);
    if ((pointer)local_3a0._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x3c7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3a0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_3a0,"\"def\"","s.stropt2",(char (*) [4])0x21765d,&local_360.stropt2);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message(&local_3b8);
    if ((pointer)local_3a0._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x3c8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_3b8.ss_.ptr_._1_7_,local_3b8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3a0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_360.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__TestSolverWithOptions_00288d48;
  local_360.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__TestSolverWithOptions_00288db8;
  local_360.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__TestSolverWithOptions_00288de0;
  local_360.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__TestSolverWithOptions_00288e10;
  local_360.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__TestSolverWithOptions_00288e30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.stropt2._M_dataplus._M_p != &local_360.stropt2.field_2) {
    operator_delete(local_360.stropt2._M_dataplus._M_p,
                    local_360.stropt2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.stropt1._M_dataplus._M_p != &local_360.stropt1.field_2) {
    operator_delete(local_360.stropt1._M_dataplus._M_p,
                    local_360.stropt1.field_2._M_allocated_capacity + 1);
  }
  local_360.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__Solver_00287fd8;
  local_360.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__Solver_00288048;
  local_360.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__Solver_00288070;
  local_360.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__Solver_002880a0;
  local_360.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__Solver_002880c0;
  if (local_360.super_Solver.suffixes_.
      super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.super_Solver.suffixes_.
                    super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_360.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_360.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)&local_360);
  return;
}

Assistant:

TEST(SolverTest, StrOptions) {
  TestSolverWithOptions s;
  EXPECT_TRUE(s.ParseOptions(Args("stropt1=abc", "stropt2=def")));
  EXPECT_EQ("abc", s.stropt1);
  EXPECT_EQ("def", s.stropt2);
}